

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::RecursiveGraphDetector::check(Graph *g,RecursiveGraphDetector *stack)

{
  RecursiveGraphDetector *pRVar1;
  bool bVar2;
  reference this;
  ProcessorInstance *pPVar3;
  ProcessorRef *pPVar4;
  QualifiedIdentifier *this_00;
  size_type sVar5;
  reference pvVar6;
  Graph *g_00;
  pool_ref<soul::AST::ModuleBase> local_1a0;
  pool_ptr<soul::AST::Graph> local_198;
  IdentifierPath local_190;
  undefined1 local_138 [8];
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  modulesFound;
  pool_ptr<soul::AST::QualifiedIdentifier> local_118;
  pool_ptr<soul::AST::QualifiedIdentifier> name;
  pool_ptr<soul::AST::Expression> local_108;
  pool_ptr<soul::AST::ProcessorRef> local_100;
  pool_ptr<soul::AST::ProcessorRef> pr;
  pool_ptr<soul::AST::Graph> sub;
  pool_ref<soul::AST::ProcessorInstance> *p;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range2;
  RecursiveGraphDetector newStack;
  IdentifierPath local_b0;
  CompileMessage local_58;
  RecursiveGraphDetector *local_20;
  RecursiveGraphDetector *s;
  RecursiveGraphDetector *stack_local;
  Graph *g_local;
  
  for (local_20 = stack; s = stack, stack_local = (RecursiveGraphDetector *)g,
      local_20 != (RecursiveGraphDetector *)0x0; local_20 = local_20->previous) {
    if (local_20->graph == g) {
      (*(g->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[0xd])();
      Errors::recursiveTypes<soul::IdentifierPath>(&local_58,&local_b0);
      AST::Context::throwError
                (&(g->super_ProcessorBase).super_ModuleBase.super_ASTObject.context,&local_58,false)
      ;
    }
  }
  __range2 = (vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
              *)stack;
  newStack.previous = (RecursiveGraphDetector *)g;
  __end2 = std::
           vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ::begin(&g->processorInstances);
  p = (pool_ref<soul::AST::ProcessorInstance> *)
      std::
      vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
      ::end(&g->processorInstances);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                                *)&p);
    if (!bVar2) {
      return;
    }
    this = __gnu_cxx::
           __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
           ::operator*(&__end2);
    pool_ptr<soul::AST::Graph>::pool_ptr((pool_ptr<soul::AST::Graph> *)&pr);
    pPVar3 = pool_ref<soul::AST::ProcessorInstance>::operator->(this);
    local_108.object = (pPVar3->targetProcessor).object;
    cast<soul::AST::ProcessorRef,soul::AST::Expression>((soul *)&local_100,&local_108);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_108);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_100);
    if (bVar2) {
      pPVar4 = pool_ptr<soul::AST::ProcessorRef>::operator->(&local_100);
      cast<soul::AST::Graph,soul::AST::ProcessorBase>((soul *)&name,pPVar4->processor);
      pr.object = (ProcessorRef *)name.object;
      pool_ptr<soul::AST::Graph>::~pool_ptr((pool_ptr<soul::AST::Graph> *)&name);
    }
    else {
      pPVar3 = pool_ref<soul::AST::ProcessorInstance>::operator->(this);
      modulesFound.
      super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pPVar3->targetProcessor).object
      ;
      cast<soul::AST::QualifiedIdentifier,soul::AST::Expression>
                ((soul *)&local_118,
                 (pool_ptr<soul::AST::Expression> *)
                 &modulesFound.
                  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pool_ptr<soul::AST::Expression>::~pool_ptr
                ((pool_ptr<soul::AST::Expression> *)
                 &modulesFound.
                  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_118);
      if (bVar2) {
        pRVar1 = stack_local + 2;
        this_00 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_118);
        AST::QualifiedIdentifier::getPath(&local_190,this_00);
        AST::Scope::getMatchingSubModules
                  ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                    *)local_138,(Scope *)&pRVar1->graph,&local_190);
        IdentifierPath::~IdentifierPath(&local_190);
        sVar5 = std::
                vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                ::size((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                        *)local_138);
        if (sVar5 == 1) {
          pvVar6 = std::
                   vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                   ::front((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                            *)local_138);
          local_1a0.object = pvVar6->object;
          cast<soul::AST::Graph,soul::AST::ModuleBase>((soul *)&local_198,&local_1a0);
          pr.object = (ProcessorRef *)local_198.object;
          pool_ptr<soul::AST::Graph>::~pool_ptr(&local_198);
          pool_ref<soul::AST::ModuleBase>::~pool_ref(&local_1a0);
        }
        std::
        vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
        ::~vector((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                   *)local_138);
      }
      pool_ptr<soul::AST::QualifiedIdentifier>::~pool_ptr(&local_118);
    }
    pool_ptr<soul::AST::ProcessorRef>::~pool_ptr(&local_100);
    bVar2 = pool_ptr<soul::AST::Graph>::operator!=((pool_ptr<soul::AST::Graph> *)&pr,(void *)0x0);
    if (bVar2) {
      g_00 = pool_ptr<soul::AST::Graph>::operator*((pool_ptr<soul::AST::Graph> *)&pr);
      check(g_00,(RecursiveGraphDetector *)&__range2);
    }
    pool_ptr<soul::AST::Graph>::~pool_ptr((pool_ptr<soul::AST::Graph> *)&pr);
    if (bVar2) break;
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void check (AST::Graph& g, const RecursiveGraphDetector* stack = nullptr)
        {
            for (auto s = stack; s != nullptr; s = s->previous)
                if (s->graph == std::addressof (g))
                    g.context.throwError (Errors::recursiveTypes (g.getFullyQualifiedPath()));

            const RecursiveGraphDetector newStack { stack, std::addressof (g) };

            for (auto& p : g.processorInstances)
            {
                // avoid using findSingleMatchingSubModule() as we don't want an error thrown if
                // a processor specialisation alias has not yet been resolved

                pool_ptr<AST::Graph> sub;

                if (auto pr = cast<AST::ProcessorRef> (p->targetProcessor))
                {
                    sub = cast<AST::Graph> (pr->processor);
                }
                else if (auto name = cast<AST::QualifiedIdentifier> (p->targetProcessor))
                {
                    auto modulesFound = g.getMatchingSubModules (name->getPath());

                    if (modulesFound.size() == 1)
                        sub = cast<AST::Graph> (modulesFound.front());
                }

                if (sub != nullptr)
                    return check (*sub, std::addressof (newStack));
            }
        }